

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Input::endBitSetScalar(Input *this)

{
  __uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> hnode;
  ret_type pSVar1;
  uint uVar2;
  ulong __n;
  reference rVar3;
  Twine local_40;
  
  if (((this->EC)._M_value == 0) &&
     (pSVar1 = dyn_cast<llvm::yaml::Input::SequenceHNode,llvm::yaml::Input::HNode>
                         (this->CurrentNode), pSVar1 != (ret_type)0x0)) {
    if ((ulong)(this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 !=
        (long)(pSVar1->Entries).
              super__Vector_base<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pSVar1->Entries).
              super__Vector_base<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) {
      __assert_fail("BitValuesUsed.size() == SQ->Entries.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLTraits.cpp"
                    ,0x147,"virtual void llvm::yaml::Input::endBitSetScalar()");
    }
    uVar2 = 0;
    do {
      __n = (ulong)uVar2;
      if ((ulong)((long)(pSVar1->Entries).
                        super__Vector_base<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pSVar1->Entries).
                        super__Vector_base<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
        return;
      }
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->BitValuesUsed,__n);
      uVar2 = uVar2 + 1;
    } while ((*rVar3._M_p & rVar3._M_mask) != 0);
    hnode._M_t.
    super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
    .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl =
         (pSVar1->Entries).
         super__Vector_base<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[__n]._M_t.
         super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
         ._M_t;
    Twine::Twine(&local_40,"unknown bit value");
    setError(this,(HNode *)hnode._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
                           .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl,
             &local_40);
  }
  return;
}

Assistant:

void Input::endBitSetScalar() {
  if (EC)
    return;
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    assert(BitValuesUsed.size() == SQ->Entries.size());
    for (unsigned i = 0; i < SQ->Entries.size(); ++i) {
      if (!BitValuesUsed[i]) {
        setError(SQ->Entries[i].get(), "unknown bit value");
        return;
      }
    }
  }
}